

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

void Curl_llist_insert_next(curl_llist *list,curl_llist_element *e,void *p,curl_llist_element *ne)

{
  curl_llist_element *local_30;
  curl_llist_element *ne_local;
  void *p_local;
  curl_llist_element *e_local;
  curl_llist *list_local;
  
  ne->ptr = p;
  if (list->size == 0) {
    list->head = ne;
    list->head->prev = (curl_llist_element *)0x0;
    list->head->next = (curl_llist_element *)0x0;
    list->tail = ne;
  }
  else {
    if (e == (curl_llist_element *)0x0) {
      local_30 = list->head;
    }
    else {
      local_30 = e->next;
    }
    ne->next = local_30;
    ne->prev = e;
    if (e == (curl_llist_element *)0x0) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if (e->next == (curl_llist_element *)0x0) {
      list->tail = ne;
    }
    else {
      e->next->prev = ne;
    }
    if (e != (curl_llist_element *)0x0) {
      e->next = ne;
    }
  }
  list->size = list->size + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct curl_llist *list, struct curl_llist_element *e,
                       const void *p,
                       struct curl_llist_element *ne)
{
  ne->ptr = (void *) p;
  if(list->size == 0) {
    list->head = ne;
    list->head->prev = NULL;
    list->head->next = NULL;
    list->tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->next = e?e->next:list->head;
    ne->prev = e;
    if(!e) {
      list->head->prev = ne;
      list->head = ne;
    }
    else if(e->next) {
      e->next->prev = ne;
    }
    else {
      list->tail = ne;
    }
    if(e)
      e->next = ne;
  }

  ++list->size;
}